

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O0

bool __thiscall SearchBase::isSubtoken(SearchBase *this,string_view strv,string_view subtoken)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  string_view *in_stack_ffffffffffffffa8;
  SearchBase *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffb8;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  removeSuffix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  removeSuffix(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8);
  __y._M_str = in_RDX;
  __y._M_len = in_RSI;
  bVar1 = std::operator==(in_stack_ffffffffffffffb8,__y);
  return bVar1;
}

Assistant:

bool isSubtoken(std::string_view strv, std::string_view subtoken) const {
		removeSuffix(strv, "<>");
		removeSuffix(strv, "&lt;&gt;");

		return strv == subtoken;
	}